

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.h
# Opt level: O2

void __thiscall cbtCylinderShape::setLocalScaling(cbtCylinderShape *this,cbtVector3 *scaling)

{
  undefined1 *v2;
  cbtScalar cVar1;
  cbtScalar cVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  cbtVector3 cVar11;
  cbtVector3 unScaledImplicitShapeDimensionsWithMargin;
  cbtVector3 implicitShapeDimensionsWithMargin;
  cbtVector3 oldMargin;
  cbtVector3 local_58;
  cbtVector3 local_48;
  cbtVector3 local_38;
  
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  cVar1 = in_ZMM0._0_4_;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  cVar2 = in_ZMM0._0_4_;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar6 = in_ZMM0._8_56_;
  auVar9 = (undefined1  [56])0x0;
  local_38.m_floats[2] = in_ZMM0._0_4_;
  local_38.m_floats[3] = 0.0;
  local_38.m_floats[0] = cVar1;
  local_38.m_floats[1] = cVar2;
  cVar11 = ::operator+(&(this->super_cbtConvexInternalShape).m_implicitShapeDimensions,&local_38);
  auVar7._0_8_ = cVar11.m_floats._8_8_;
  auVar7._8_56_ = auVar9;
  auVar3._0_8_ = cVar11.m_floats._0_8_;
  auVar3._8_56_ = auVar6;
  v2 = &(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.field_0x1c
  ;
  local_48.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar3._0_16_,auVar7._0_16_);
  auVar6 = ZEXT856(local_48.m_floats._8_8_);
  cVar11 = ::operator/(&local_48,(cbtVector3 *)v2);
  auVar8._0_8_ = cVar11.m_floats._8_8_;
  auVar8._8_56_ = auVar9;
  auVar4._0_8_ = cVar11.m_floats._0_8_;
  auVar4._8_56_ = auVar6;
  local_58.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar4._0_16_,auVar8._0_16_);
  auVar6 = ZEXT856(local_58.m_floats._8_8_);
  cbtConvexInternalShape::setLocalScaling(&this->super_cbtConvexInternalShape,scaling);
  cVar11 = ::operator*(&local_58,(cbtVector3 *)v2);
  auVar5._0_8_ = cVar11.m_floats._0_8_;
  auVar5._8_56_ = auVar6;
  auVar10._4_4_ = local_38.m_floats[1];
  auVar10._0_4_ = local_38.m_floats[0];
  auVar10._8_8_ = 0;
  auVar10 = vsubps_avx(auVar5._0_16_,auVar10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(cVar11.m_floats[2] - local_38.m_floats[2])),0x28);
  *(undefined1 (*) [16])(this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats =
       auVar10;
  return;
}

Assistant:

virtual void setLocalScaling(const cbtVector3& scaling)
	{
		cbtVector3 oldMargin(getMargin(), getMargin(), getMargin());
		cbtVector3 implicitShapeDimensionsWithMargin = m_implicitShapeDimensions + oldMargin;
		cbtVector3 unScaledImplicitShapeDimensionsWithMargin = implicitShapeDimensionsWithMargin / m_localScaling;

		cbtConvexInternalShape::setLocalScaling(scaling);

		m_implicitShapeDimensions = (unScaledImplicitShapeDimensionsWithMargin * m_localScaling) - oldMargin;
	}